

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addExecutionMode
          (Builder *this,Function *entryPoint,ExecutionMode mode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literals)

{
  bool bVar1;
  Id id;
  Instruction *this_00;
  size_type sVar2;
  reference puVar3;
  value_type local_58;
  uint local_4c;
  const_iterator cStack_48;
  uint literal;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  Instruction *instr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literals_local;
  ExecutionMode mode_local;
  Function *entryPoint_local;
  Builder *this_local;
  
  if (entryPoint != (Function *)0x0) {
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,OpExecutionMode);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(literals);
    spv::Instruction::reserveOperands(this_00,sVar2 + 2);
    id = spv::Function::getId(entryPoint);
    spv::Instruction::addIdOperand(this_00,id);
    spv::Instruction::addImmediateOperand(this_00,mode);
    __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(literals);
    cStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(literals);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end1);
      local_4c = *puVar3;
      spv::Instruction::addImmediateOperand(this_00,local_4c);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end1);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_58,
               this_00);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->executionModes,&local_58);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_58);
  }
  return;
}

Assistant:

void Builder::addExecutionMode(Function* entryPoint, ExecutionMode mode, const std::vector<unsigned>& literals)
{
    // entryPoint can be null if we are in compile-only mode
    if (!entryPoint)
        return;

    Instruction* instr = new Instruction(OpExecutionMode);
    instr->reserveOperands(literals.size() + 2);
    instr->addIdOperand(entryPoint->getId());
    instr->addImmediateOperand(mode);
    for (auto literal : literals)
        instr->addImmediateOperand(literal);

    executionModes.push_back(std::unique_ptr<Instruction>(instr));
}